

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Opt::parse(Opt *this,string *param_2,TokenStream *tokens)

{
  StringRef rhs;
  StringRef rhs_00;
  StringRef lhs;
  StringRef lhs_00;
  StringRef optToken;
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar5;
  Token *pTVar6;
  element_type *peVar7;
  ParseResultType *pPVar8;
  ParseState *this_00;
  long *in_RSI;
  InternalParseResult *in_RDI;
  ParserResult result_1;
  Token *argToken;
  BoundValueRefBase *valueRef;
  ParserResult result;
  BoundFlagRefBase *flagRef;
  Token *token;
  Result validationResult;
  ParseState *in_stack_fffffffffffffc18;
  BasicResult<Catch::Clara::ParseResultType> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  ParseResultType PVar9;
  ParseState *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  BasicResult<Catch::Clara::Detail::ParseState> *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  char *in_stack_fffffffffffffc70;
  size_type in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined5 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8d;
  undefined1 in_stack_fffffffffffffc8e;
  undefined1 in_stack_fffffffffffffc8f;
  undefined7 in_stack_fffffffffffffc98;
  BasicResult<Catch::Clara::ParseResultType> local_330;
  undefined1 local_2d8 [88];
  undefined1 local_280 [120];
  BasicResult local_208 [48];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  string local_1b8 [32];
  int local_198 [6];
  int *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  string local_150 [32];
  element_type *local_130;
  BasicResult local_d0 [48];
  element_type *local_a0;
  undefined1 local_80 [24];
  undefined1 *local_68;
  int local_60;
  BasicResult local_50 [80];
  
  (**(code **)(*in_RSI + 0x10))();
  bVar2 = Detail::BasicResult::operator_cast_to_bool(local_50);
  if (!bVar2) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (in_stack_fffffffffffffc40,
               (BasicResult<void> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    local_60 = 1;
    goto LAB_00186c11;
  }
  uVar3 = Detail::TokenStream::operator_cast_to_bool((TokenStream *)in_stack_fffffffffffffc20);
  if (((bool)uVar3) &&
     (pTVar6 = Detail::TokenStream::operator->((TokenStream *)0x186421), pTVar6->type == Option)) {
    Detail::TokenStream::operator*((TokenStream *)in_stack_fffffffffffffc20);
    local_68 = local_80;
    optToken.m_size._0_7_ = in_stack_fffffffffffffc98;
    optToken.m_start = (char *)pTVar6;
    optToken.m_size._7_1_ = uVar3;
    uVar3 = isMatch((Opt *)CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,
                                             CONCAT15(in_stack_fffffffffffffc8d,
                                                      in_stack_fffffffffffffc88))),optToken);
    if ((bool)uVar3) {
      peVar7 = std::
               __shared_ptr_access<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1864b2);
      uVar5 = (*peVar7->_vptr_BoundRef[3])();
      uVar4 = (undefined1)uVar5;
      if ((uVar5 & 1) == 0) {
        local_130 = std::__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                    get((__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *)
                        (in_RSI + 2));
        Detail::TokenStream::operator++((TokenStream *)in_stack_fffffffffffffc40);
        bVar2 = Detail::TokenStream::operator_cast_to_bool((TokenStream *)in_stack_fffffffffffffc20)
        ;
        if (!bVar2) {
          StringRef::StringRef((StringRef *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          local_178 = *(undefined8 *)(local_68 + 8);
          uStack_170 = *(undefined8 *)(local_68 + 0x10);
          lhs.m_size._0_5_ = in_stack_fffffffffffffc88;
          lhs.m_start = (char *)in_stack_fffffffffffffc80;
          lhs.m_size._5_1_ = in_stack_fffffffffffffc8d;
          lhs.m_size._6_1_ = uVar4;
          lhs.m_size._7_1_ = uVar3;
          rhs.m_size = in_stack_fffffffffffffc78;
          rhs.m_start = in_stack_fffffffffffffc70;
          operator+[abi_cxx11_(lhs,rhs);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                    ((string *)in_stack_fffffffffffffc18);
          std::__cxx11::string::~string(local_150);
          local_60 = 1;
          goto LAB_00186c11;
        }
        Detail::TokenStream::operator*((TokenStream *)in_stack_fffffffffffffc20);
        peVar1 = local_130;
        local_180 = local_198;
        if (local_198[0] != 1) {
          StringRef::StringRef((StringRef *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          local_1d8 = *(undefined8 *)(local_68 + 8);
          uStack_1d0 = *(undefined8 *)(local_68 + 0x10);
          lhs_00.m_size._0_5_ = in_stack_fffffffffffffc88;
          lhs_00.m_start = (char *)in_stack_fffffffffffffc80;
          lhs_00.m_size._5_1_ = in_stack_fffffffffffffc8d;
          lhs_00.m_size._6_1_ = uVar4;
          lhs_00.m_size._7_1_ = uVar3;
          rhs_00.m_size = in_stack_fffffffffffffc78;
          rhs_00.m_start = in_stack_fffffffffffffc70;
          operator+[abi_cxx11_(lhs_00,rhs_00);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                    ((string *)in_stack_fffffffffffffc18);
          std::__cxx11::string::~string(local_1b8);
          local_60 = 1;
          goto LAB_00186c11;
        }
        StringRef::operator_cast_to_string
                  ((StringRef *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
        PVar9 = (ParseResultType)((ulong)in_stack_fffffffffffffc28 >> 0x20);
        (*peVar1->_vptr_BoundRef[4])(local_208,peVar1,local_280 + 0x58);
        std::__cxx11::string::~string((string *)(local_280 + 0x58));
        bVar2 = Detail::BasicResult::operator_cast_to_bool(local_208);
        if (bVar2) {
          pPVar8 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                             (&in_stack_fffffffffffffc20->
                               super_ResultValueBase<Catch::Clara::ParseResultType>);
          if (*pPVar8 == ShortCircuitAll) {
            Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                      (&in_stack_fffffffffffffc20->
                        super_ResultValueBase<Catch::Clara::ParseResultType>);
            in_stack_fffffffffffffc40 = (BasicResult<Catch::Clara::Detail::ParseState> *)local_280;
            Detail::TokenStream::TokenStream
                      ((TokenStream *)in_stack_fffffffffffffc20,
                       (TokenStream *)in_stack_fffffffffffffc18);
            Detail::ParseState::ParseState
                      (in_stack_fffffffffffffc30,PVar9,(TokenStream *)in_stack_fffffffffffffc20);
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(in_stack_fffffffffffffc18);
            Detail::ParseState::~ParseState((ParseState *)0x1869f0);
            Detail::TokenStream::~TokenStream((TokenStream *)0x1869fd);
            local_60 = 1;
          }
          else {
            local_60 = 0;
          }
        }
        else {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>
                    (in_stack_fffffffffffffc40,
                     (BasicResult<Catch::Clara::ParseResultType> *)
                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          local_60 = 1;
        }
        Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(in_stack_fffffffffffffc20);
      }
      else {
        local_a0 = std::__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                   get((__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *)
                       (in_RSI + 2));
        PVar9 = (ParseResultType)((ulong)in_stack_fffffffffffffc28 >> 0x20);
        (*local_a0->_vptr_BoundRef[4])(local_d0,local_a0,1);
        bVar2 = Detail::BasicResult::operator_cast_to_bool(local_d0);
        if (bVar2) {
          pPVar8 = Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                             (&in_stack_fffffffffffffc20->
                               super_ResultValueBase<Catch::Clara::ParseResultType>);
          if (*pPVar8 == ShortCircuitAll) {
            Detail::ResultValueBase<Catch::Clara::ParseResultType>::value
                      (&in_stack_fffffffffffffc20->
                        super_ResultValueBase<Catch::Clara::ParseResultType>);
            Detail::TokenStream::TokenStream
                      ((TokenStream *)in_stack_fffffffffffffc20,
                       (TokenStream *)in_stack_fffffffffffffc18);
            Detail::ParseState::ParseState
                      (in_stack_fffffffffffffc30,PVar9,(TokenStream *)in_stack_fffffffffffffc20);
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(in_stack_fffffffffffffc18);
            Detail::ParseState::~ParseState((ParseState *)0x1865fe);
            Detail::TokenStream::~TokenStream((TokenStream *)0x18660b);
            local_60 = 1;
          }
          else {
            local_60 = 0;
          }
        }
        else {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>
                    (in_stack_fffffffffffffc40,
                     (BasicResult<Catch::Clara::ParseResultType> *)
                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          local_60 = 1;
        }
        Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(in_stack_fffffffffffffc20);
      }
      if (local_60 == 0) {
        this_00 = (ParseState *)
                  Detail::TokenStream::operator++((TokenStream *)in_stack_fffffffffffffc40);
        PVar9 = (ParseResultType)((ulong)local_2d8 >> 0x20);
        Detail::TokenStream::TokenStream
                  ((TokenStream *)in_stack_fffffffffffffc20,(TokenStream *)in_stack_fffffffffffffc18
                  );
        Detail::ParseState::ParseState(this_00,PVar9,(TokenStream *)in_stack_fffffffffffffc20);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (in_stack_fffffffffffffc18);
        Detail::ParseState::~ParseState((ParseState *)0x186af2);
        Detail::TokenStream::~TokenStream((TokenStream *)0x186aff);
        local_60 = 1;
      }
      goto LAB_00186c11;
    }
  }
  PVar9 = (ParseResultType)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  in_stack_fffffffffffffc20 = &local_330;
  Detail::TokenStream::TokenStream
            ((TokenStream *)in_stack_fffffffffffffc20,(TokenStream *)in_stack_fffffffffffffc18);
  Detail::ParseState::ParseState
            (in_stack_fffffffffffffc30,PVar9,(TokenStream *)in_stack_fffffffffffffc20);
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
            (in_stack_fffffffffffffc18);
  Detail::ParseState::~ParseState((ParseState *)0x186bb1);
  Detail::TokenStream::~TokenStream((TokenStream *)0x186bbe);
  local_60 = 1;
LAB_00186c11:
  Detail::BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffc20);
  return in_RDI;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            if (tokens &&
                tokens->type == Detail::TokenType::Option) {
                auto const& token = *tokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++tokens;
                        if (!tokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *tokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(static_cast<std::string>(argToken.token));
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, CATCH_MOVE(++tokens)));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }